

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

InterfaceHandle __thiscall
helics::CommonCore::registerDataSink(CommonCore *this,LocalFederateId federateID,string_view name)

{
  string_view name_00;
  string_view string1;
  string_view key;
  string_view type;
  string_view units;
  string_view units_00;
  string_view key_00;
  uint16_t uVar1;
  undefined4 uVar2;
  InterfaceHandle IVar3;
  _Alloc_hider this_00;
  undefined6 extraout_var;
  BasicHandleInfo *this_01;
  char *in_RCX;
  size_t in_RDX;
  CommonCore *in_RDI;
  __sv_type _Var4;
  ActionMessage reg;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
  *handle;
  uint16_t sinkFlags;
  FederateState *fed;
  InterfaceHandle hid;
  atomic<helics::GlobalFederateId> *in_stack_fffffffffffffdc8;
  uint in_stack_fffffffffffffdd0;
  uint in_stack_fffffffffffffdd4;
  undefined4 uVar5;
  FederateState *in_stack_fffffffffffffdd8;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  basic_string_view<char,_std::char_traits<char>_> *this_02;
  action_t in_stack_fffffffffffffdec;
  InterfaceType HandleType;
  CommonCore *this_03;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 uVar7;
  undefined8 in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  uint16_t in_stack_fffffffffffffe50;
  uint16_t in_stack_fffffffffffffec4;
  InterfaceType in_stack_fffffffffffffec7;
  FederateState *in_stack_fffffffffffffec8;
  string_view in_stack_fffffffffffffed0;
  InterfaceHandle in_stack_fffffffffffffee4;
  string_view in_stack_fffffffffffffef0;
  size_t in_stack_ffffffffffffff00;
  basic_string_view<char,_std::char_traits<char>_> *pbStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_b8 [32];
  __sv_type local_98;
  Time TStack_80;
  BaseType local_60;
  BaseType local_5c;
  Time local_58;
  ushort local_4a;
  _Alloc_hider in_stack_ffffffffffffffd8;
  _Alloc_hider _Var8;
  LocalFederateId in_stack_fffffffffffffffc;
  
  uVar7 = 0x73;
  key_00._M_str = in_RCX;
  key_00._M_len = in_RDX;
  this_00._M_p = (pointer)checkNewInterface(in_RDI,in_stack_fffffffffffffffc,key_00,
                                            (InterfaceType)
                                            ((ulong)in_stack_ffffffffffffffd8._M_p >> 0x38));
  uVar1 = FederateState::getInterfaceFlags(in_stack_fffffffffffffdd8);
  uVar2 = (undefined4)CONCAT62(extraout_var,uVar1);
  uVar1 = make_flags(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0);
  local_4a = (ushort)uVar2 | uVar1;
  local_5c = (BaseType)std::atomic::operator_cast_to_GlobalFederateId(in_stack_fffffffffffffdc8);
  HandleType = (InterfaceType)((uint)uVar2 >> 0x18);
  local_60 = ((LocalFederateId *)(this_00._M_p + 0x28))->fid;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde0,
             (char *)in_stack_fffffffffffffdd8);
  this_03 = (CommonCore *)local_b8;
  std::__cxx11::string::string(in_stack_fffffffffffffde0);
  local_98 = std::__cxx11::string::operator_cast_to_basic_string_view
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  uVar2 = (undefined4)TStack_80.internalTimeCode;
  uVar5 = (undefined4)((ulong)TStack_80.internalTimeCode >> 0x20);
  key._M_str._0_4_ = in_stack_fffffffffffffe18;
  key._M_len = (size_t)in_RDI;
  key._M_str._4_4_ = uVar7;
  type._M_str = in_stack_fffffffffffffe38;
  type._M_len = in_stack_fffffffffffffe30;
  units._M_str._0_4_ = in_stack_fffffffffffffe48;
  units._M_len = in_stack_fffffffffffffe40;
  units._M_str._4_4_ = in_stack_fffffffffffffe4c;
  pcVar6 = (char *)local_98._M_len;
  this_02 = (basic_string_view<char,_std::char_traits<char>_> *)local_98._M_str;
  this_01 = (BasicHandleInfo *)
            createBasicHandle(this_03,(GlobalFederateId)
                                      (BaseType)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                              (LocalFederateId)(BaseType)in_stack_fffffffffffffe20,HandleType,key,
                              type,units,in_stack_fffffffffffffe50);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(uVar5,uVar2));
  local_58.internalTimeCode = (baseType)this_01;
  IVar3 = BasicHandleInfo::getInterfaceHandle(this_01);
  _Var8._M_p = this_00._M_p;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_02,pcVar6);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uVar5,uVar2));
  pcVar6 = (char *)_Var4._M_len;
  pbStack_f0 = (basic_string_view<char,_std::char_traits<char>_> *)_Var4._M_str;
  uVar2 = (undefined4)uStack_e0;
  uVar5 = (undefined4)((ulong)uStack_e0 >> 0x20);
  units_00._M_str = pcVar6;
  units_00._M_len = in_stack_ffffffffffffff00;
  FederateState::createInterface
            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec7,in_stack_fffffffffffffee4,
             in_stack_fffffffffffffed0,in_stack_fffffffffffffef0,units_00,in_stack_fffffffffffffec4)
  ;
  ActionMessage::ActionMessage((ActionMessage *)this_00._M_p,in_stack_fffffffffffffdec);
  std::atomic<helics::GlobalFederateId>::load
            ((atomic<helics::GlobalFederateId> *)(_Var8._M_p + 0x2c),seq_cst);
  name_00._M_str._0_4_ = uVar2;
  name_00._M_len = local_e8;
  name_00._M_str._4_4_ = uVar5;
  ActionMessage::name((ActionMessage *)0x52a1b1,name_00);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(pbStack_f0,pcVar6);
  string1._M_str = (char *)pbStack_f0;
  string1._M_len = (size_t)pcVar6;
  ActionMessage::setStringData((ActionMessage *)CONCAT44(uVar5,uVar2),string1);
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  push<helics::ActionMessage>
            ((BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
             in_RDI,(ActionMessage *)this_03);
  ActionMessage::~ActionMessage((ActionMessage *)CONCAT44(uVar5,uVar2));
  return (InterfaceHandle)IVar3.hid;
}

Assistant:

InterfaceHandle CommonCore::registerDataSink(LocalFederateId federateID, std::string_view name)
{
    auto* fed = checkNewInterface(federateID, name, InterfaceType::SINK);
    const uint16_t sinkFlags =
        fed->getInterfaceFlags() | make_flags(receive_only_flag, targeted_flag);

    const auto& handle = createBasicHandle(
        fed->global_id, fed->local_id, InterfaceType::SINK, name, "sink", std::string{}, sinkFlags);

    auto hid = handle.getInterfaceHandle();
    fed->createInterface(InterfaceType::SINK, hid, name, "sink", gEmptyString, sinkFlags);
    ActionMessage reg(CMD_REG_DATASINK);
    reg.source_id = fed->global_id.load();
    reg.source_handle = hid;
    reg.name(name);
    reg.setStringData("sink");
    reg.flags = handle.flags;
    actionQueue.push(std::move(reg));

    return hid;
}